

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void backpressure_check(CManager_conflict cm,EVstone s)

{
  int iVar1;
  int iVar2;
  stone_type p_Var3;
  attr_list p_Var4;
  int high_threshold;
  int low_threshold;
  int local_38;
  int local_34;
  
  if (cm->evp->use_backpressure != 0) {
    p_Var3 = stone_struct(cm->evp,s);
    iVar1 = p_Var3->is_stalled;
    local_34 = 0x32;
    local_38 = 200;
    p_Var4 = p_Var3->stone_attrs;
    if (p_Var4 != (attr_list)0x0) {
      if (backpressure_check::EV_BACKPRESSURE_HIGH == -1) {
        backpressure_check::EV_BACKPRESSURE_HIGH = attr_atom_from_string("EV_BACKPRESSURE_HIGH");
        backpressure_check::EV_BACKPRESSURE_LOW = attr_atom_from_string("EV_BACKPRESSURE_LOW");
        p_Var4 = p_Var3->stone_attrs;
      }
      get_int_attr(p_Var4,backpressure_check::EV_BACKPRESSURE_HIGH,&local_38);
      get_int_attr(p_Var3->stone_attrs,backpressure_check::EV_BACKPRESSURE_LOW,&local_34);
    }
    iVar2 = local_38;
    if (iVar1 != 0) {
      iVar2 = local_34;
    }
    backpressure_transition(cm,s,Stall_Overload,(uint)(iVar2 < p_Var3->queue_size));
  }
  return;
}

Assistant:

static void
backpressure_check(CManager cm, EVstone s) {
    if (cm->evp->use_backpressure) {
        stone_type stone = stone_struct(cm->evp, s);
        int old_stalled = stone->is_stalled;
        int low_threshold = 50, high_threshold = 200;
        if (stone->stone_attrs) {
	    static atom_t EV_BACKPRESSURE_HIGH = -1;
	    static atom_t EV_BACKPRESSURE_LOW = -1;
	    if (EV_BACKPRESSURE_HIGH == -1) {
		EV_BACKPRESSURE_HIGH = attr_atom_from_string("EV_BACKPRESSURE_HIGH");
		EV_BACKPRESSURE_LOW = attr_atom_from_string("EV_BACKPRESSURE_LOW");
	    }
            get_int_attr(stone->stone_attrs, EV_BACKPRESSURE_HIGH, &high_threshold);
            get_int_attr(stone->stone_attrs, EV_BACKPRESSURE_LOW, &low_threshold);
        }
        backpressure_transition(cm, s, Stall_Overload,
            (stone->queue_size > (old_stalled ? low_threshold : high_threshold)));
    }
}